

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FloatStateQueryTests::init(FloatStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  GetBooleanVerifier *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  GetIntegerVerifier *this_01;
  undefined4 extraout_var_00;
  GetInteger64Verifier *this_02;
  undefined4 extraout_var_01;
  GetFloatVerifier *this_03;
  undefined4 extraout_var_02;
  DepthRangeCase *this_04;
  char *pcVar6;
  StateVerifier *pSVar7;
  LineWidthCase *this_05;
  PolygonOffsetFactorCase *this_06;
  PolygonOffsetUnitsCase *this_07;
  SampleCoverageCase *this_08;
  BlendColorCase *this_09;
  ColorClearCase *this_10;
  DepthClearCase *this_11;
  MaxTextureLODBiasCase *this_12;
  AliasedPointSizeRangeCase *this_13;
  AliasedLineWidthRangeCase *this_14;
  allocator<char> local_3b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  StateVerifier *local_378;
  StateVerifier *verifier_10;
  int _verifierNdx_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  StateVerifier *local_328;
  StateVerifier *verifier_9;
  int _verifierNdx_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  StateVerifier *local_2d8;
  StateVerifier *verifier_8;
  int _verifierNdx_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  StateVerifier *local_288;
  StateVerifier *verifier_7;
  int _verifierNdx_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  StateVerifier *local_238;
  StateVerifier *verifier_6;
  int _verifierNdx_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  StateVerifier *local_1e8;
  StateVerifier *verifier_5;
  int _verifierNdx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  StateVerifier *local_198;
  StateVerifier *verifier_4;
  int _verifierNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  StateVerifier *local_148;
  StateVerifier *verifier_3;
  int _verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  StateVerifier *local_f8;
  StateVerifier *verifier_2;
  int _verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  StateVerifier *local_a8;
  StateVerifier *verifier_1;
  int _verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  StateVerifier *local_58;
  StateVerifier *verifier;
  GetBooleanVerifier *pGStack_48;
  int _verifierNdx;
  StateVerifier *verifiers [4];
  FloatStateQueryTests *this_local;
  
  this_00 = (GetBooleanVerifier *)operator_new(0x28);
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  FloatStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar2),pTVar5);
  this->m_verifierBoolean = this_00;
  this_01 = (GetIntegerVerifier *)operator_new(0x28);
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  FloatStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar2),pTVar5);
  this->m_verifierInteger = this_01;
  this_02 = (GetInteger64Verifier *)operator_new(0x28);
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  FloatStateQueryVerifiers::GetInteger64Verifier::GetInteger64Verifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar2),pTVar5);
  this->m_verifierInteger64 = this_02;
  this_03 = (GetFloatVerifier *)operator_new(0x28);
  pRVar3 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar5 = tcu::TestContext::getLog(pTVar4);
  FloatStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_03,(Functions *)CONCAT44(extraout_var_02,iVar2),pTVar5);
  this->m_verifierFloat = this_03;
  pGStack_48 = this->m_verifierBoolean;
  verifiers[0] = &this->m_verifierInteger->super_StateVerifier;
  verifiers[1] = &this->m_verifierInteger64->super_StateVerifier;
  pSVar7 = &this->m_verifierFloat->super_StateVerifier;
  verifiers[2] = pSVar7;
  verifier._4_4_ = 0;
  while ((int)verifier._4_4_ < 4) {
    local_58 = verifiers[(long)(int)verifier._4_4_ + -1];
    this_04 = (DepthRangeCase *)operator_new(0xa0);
    pSVar7 = local_58;
    verifier_1._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_1,"depth_range",(allocator<char> *)((long)&verifier_1 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_58);
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_1,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::DepthRangeCase::DepthRangeCase(this_04,pCVar1,pSVar7,pcVar6,"DEPTH_RANGE");
    verifier_1._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&_verifierNdx_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_1 + 7));
    verifier._4_4_ = verifier._4_4_ + 1;
    pSVar7 = (StateVerifier *)(ulong)verifier._4_4_;
  }
  verifier_1._0_4_ = 0;
  while ((int)(uint)verifier_1 < 4) {
    local_a8 = verifiers[(long)(int)(uint)verifier_1 + -1];
    this_05 = (LineWidthCase *)operator_new(0xa0);
    pSVar7 = local_a8;
    verifier_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_2,"line_width",(allocator<char> *)((long)&verifier_2 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_a8);
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_2,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::LineWidthCase::LineWidthCase(this_05,pCVar1,pSVar7,pcVar6,"LINE_WIDTH");
    verifier_2._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&_verifierNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_2 + 7));
    verifier_1._0_4_ = (uint)verifier_1 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_1;
  }
  verifier_2._0_4_ = 0;
  while ((int)(uint)verifier_2 < 4) {
    local_f8 = verifiers[(long)(int)(uint)verifier_2 + -1];
    this_06 = (PolygonOffsetFactorCase *)operator_new(0xa0);
    pSVar7 = local_f8;
    verifier_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_3,"polygon_offset_factor",
               (allocator<char> *)((long)&verifier_3 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_f8);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_3,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::PolygonOffsetFactorCase::PolygonOffsetFactorCase
              (this_06,pCVar1,pSVar7,pcVar6,"POLYGON_OFFSET_FACTOR");
    verifier_3._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&_verifierNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_3 + 7));
    verifier_2._0_4_ = (uint)verifier_2 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_2;
  }
  verifier_3._0_4_ = 0;
  while ((int)(uint)verifier_3 < 4) {
    local_148 = verifiers[(long)(int)(uint)verifier_3 + -1];
    this_07 = (PolygonOffsetUnitsCase *)operator_new(0xa0);
    pSVar7 = local_148;
    verifier_4._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_4,"polygon_offset_units",
               (allocator<char> *)((long)&verifier_4 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_148);
    std::operator+(&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_4,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::PolygonOffsetUnitsCase::PolygonOffsetUnitsCase
              (this_07,pCVar1,pSVar7,pcVar6,"POLYGON_OFFSET_UNITS");
    verifier_4._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&_verifierNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_4 + 7));
    verifier_3._0_4_ = (uint)verifier_3 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_3;
  }
  verifier_4._0_4_ = 0;
  while ((int)(uint)verifier_4 < 4) {
    local_198 = verifiers[(long)(int)(uint)verifier_4 + -1];
    this_08 = (SampleCoverageCase *)operator_new(0xa0);
    pSVar7 = local_198;
    verifier_5._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_5,"sample_coverage_value",
               (allocator<char> *)((long)&verifier_5 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_198);
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_5,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SampleCoverageCase::SampleCoverageCase
              (this_08,pCVar1,pSVar7,pcVar6,"SAMPLE_COVERAGE_VALUE");
    verifier_5._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&_verifierNdx_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_5 + 7));
    verifier_4._0_4_ = (uint)verifier_4 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_4;
  }
  verifier_5._0_4_ = 0;
  while ((int)(uint)verifier_5 < 4) {
    local_1e8 = verifiers[(long)(int)(uint)verifier_5 + -1];
    this_09 = (BlendColorCase *)operator_new(0xa0);
    pSVar7 = local_1e8;
    verifier_6._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_6,"blend_color",(allocator<char> *)((long)&verifier_6 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1e8);
    std::operator+(&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_6,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::BlendColorCase::BlendColorCase(this_09,pCVar1,pSVar7,pcVar6,"BLEND_COLOR");
    verifier_6._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&_verifierNdx_6);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_6 + 7));
    verifier_5._0_4_ = (uint)verifier_5 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_5;
  }
  verifier_6._0_4_ = 0;
  while ((int)(uint)verifier_6 < 4) {
    local_238 = verifiers[(long)(int)(uint)verifier_6 + -1];
    this_10 = (ColorClearCase *)operator_new(0xa0);
    pSVar7 = local_238;
    verifier_7._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_7,"color_clear_value",
               (allocator<char> *)((long)&verifier_7 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_238);
    std::operator+(&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_7,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ColorClearCase::ColorClearCase(this_10,pCVar1,pSVar7,pcVar6,"COLOR_CLEAR_VALUE")
    ;
    verifier_7._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&_verifierNdx_7);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_7 + 7));
    verifier_6._0_4_ = (uint)verifier_6 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_6;
  }
  verifier_7._0_4_ = 0;
  while ((int)(uint)verifier_7 < 4) {
    local_288 = verifiers[(long)(int)(uint)verifier_7 + -1];
    this_11 = (DepthClearCase *)operator_new(0xa0);
    pSVar7 = local_288;
    verifier_8._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_8,"depth_clear_value",
               (allocator<char> *)((long)&verifier_8 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_288);
    std::operator+(&local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_8,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::DepthClearCase::DepthClearCase(this_11,pCVar1,pSVar7,pcVar6,"DEPTH_CLEAR_VALUE")
    ;
    verifier_8._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&_verifierNdx_8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_8 + 7));
    verifier_7._0_4_ = (uint)verifier_7 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_7;
  }
  verifier_8._0_4_ = 0;
  while ((int)(uint)verifier_8 < 4) {
    local_2d8 = verifiers[(long)(int)(uint)verifier_8 + -1];
    this_12 = (MaxTextureLODBiasCase *)operator_new(0xa0);
    pSVar7 = local_2d8;
    verifier_9._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_9,"max_texture_lod_bias",
               (allocator<char> *)((long)&verifier_9 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_2d8);
    std::operator+(&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_9,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::MaxTextureLODBiasCase::MaxTextureLODBiasCase
              (this_12,pCVar1,pSVar7,pcVar6,"MAX_TEXTURE_LOD_BIAS");
    verifier_9._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&_verifierNdx_9);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_9 + 7));
    verifier_8._0_4_ = (uint)verifier_8 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_8;
  }
  verifier_9._0_4_ = 0;
  while ((int)(uint)verifier_9 < 4) {
    local_328 = verifiers[(long)(int)(uint)verifier_9 + -1];
    this_13 = (AliasedPointSizeRangeCase *)operator_new(0xa0);
    pSVar7 = local_328;
    verifier_10._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_10,"aliased_point_size_range",
               (allocator<char> *)((long)&verifier_10 + 7));
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_328);
    std::operator+(&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_10,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::AliasedPointSizeRangeCase::AliasedPointSizeRangeCase
              (this_13,pCVar1,pSVar7,pcVar6,"ALIASED_POINT_SIZE_RANGE");
    verifier_10._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&_verifierNdx_10);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_10 + 7));
    verifier_9._0_4_ = (uint)verifier_9 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_9;
  }
  verifier_10._0_4_ = 0;
  while ((int)(uint)verifier_10 < 4) {
    local_378 = verifiers[(long)(int)(uint)verifier_10 + -1];
    this_14 = (AliasedLineWidthRangeCase *)operator_new(0xa0);
    pSVar7 = local_378;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"aliased_line_width_range",&local_3b9);
    pcVar6 = FloatStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_378);
    std::operator+(&local_398,&local_3b8,pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::AliasedLineWidthRangeCase::AliasedLineWidthRangeCase
              (this_14,pCVar1,pSVar7,pcVar6,"ALIASED_LINE_WIDTH_RANGE");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    verifier_10._0_4_ = (uint)verifier_10 + 1;
    pSVar7 = (StateVerifier *)(ulong)(uint)verifier_10;
  }
  return (int)pSVar7;
}

Assistant:

void FloatStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	FOR_EACH_VERIFIER(verifiers, addChild(new DepthRangeCase				(m_context, verifier,	(std::string("depth_range")					+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new LineWidthCase					(m_context, verifier,	(std::string("line_width")					+ verifier->getTestNamePostfix()).c_str(),	"LINE_WIDTH")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetFactorCase		(m_context, verifier,	(std::string("polygon_offset_factor")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_FACTOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetUnitsCase		(m_context, verifier,	(std::string("polygon_offset_units")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_UNITS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new SampleCoverageCase			(m_context, verifier,	(std::string("sample_coverage_value")		+ verifier->getTestNamePostfix()).c_str(),	"SAMPLE_COVERAGE_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new BlendColorCase				(m_context, verifier,	(std::string("blend_color")					+ verifier->getTestNamePostfix()).c_str(),	"BLEND_COLOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new ColorClearCase				(m_context, verifier,	(std::string("color_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"COLOR_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new DepthClearCase				(m_context, verifier,	(std::string("depth_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new MaxTextureLODBiasCase			(m_context, verifier,	(std::string("max_texture_lod_bias")		+ verifier->getTestNamePostfix()).c_str(),	"MAX_TEXTURE_LOD_BIAS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedPointSizeRangeCase		(m_context, verifier,	(std::string("aliased_point_size_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_POINT_SIZE_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedLineWidthRangeCase		(m_context, verifier,	(std::string("aliased_line_width_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_LINE_WIDTH_RANGE")));
}